

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainILR.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string filename;
  AST ast;
  long *local_80;
  char *local_78;
  long local_70 [2];
  AST local_60;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, World!",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"vbn/tim.cpp","");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,local_80,local_78 + (long)local_80);
  AST::AST(&local_60,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x12a07d);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_80,local_78 + (long)local_80);
  AST::toDot(&local_60,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    std::cout << "Hello, World!" << std::endl;

    std::string filename = "vbn/tim.cpp";
    AST ast(filename);

    filename = "output/parsed.dot";
    ast.toDot(filename);
}